

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::ReshapeLayerParams::_internal_add_targetshape
          (ReshapeLayerParams *this,int64_t value)

{
  int64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<long>::Add(&this->targetshape_,&local_8);
  return;
}

Assistant:

inline void ReshapeLayerParams::_internal_add_targetshape(int64_t value) {
  targetshape_.Add(value);
}